

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_any_tests.cpp
# Opt level: O2

void character(void)

{
  char i;
  stringstream ss;
  char local_1c1;
  Assert local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  stringstream local_190 [16];
  ostream local_180 [376];
  
  local_1c1 = 'c';
  std::__cxx11::stringstream::stringstream(local_190);
  local_1b0._M_dataplus._M_p = &local_1c1;
  UnitTests::stream_any_details::operator<<(local_180,(outputter<char> *)&local_1b0);
  local_1c0.m_file =
       "/workspace/llm4binary/github/license_all_cmakelists_25/john-mullins[P]TestFramework/tests/stream_any_tests.cpp"
  ;
  local_1c0.m_line = 0x2b;
  std::__cxx11::stringbuf::str();
  UnitTests::Assert::Equals<char[2],std::__cxx11::string>
            (&local_1c0,(char (*) [2])0x111680,&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::stringstream::~stringstream(local_190);
  return;
}

Assistant:

TEST(character)
{
    auto i  = 'c';
    auto ss = std::stringstream{};
    ss << UnitTests::stream_any(i);
    ASSERT_EQUALS("c", ss.str());
}